

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint64_t absl::lts_20240722::hash_internal::CityHash64(char *s,size_t len)

{
  unsigned_long uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  long lVar4;
  char *s_00;
  pair<unsigned_long,_unsigned_long> local_78;
  pair<unsigned_long,_unsigned_long> local_68;
  undefined1 local_58 [8];
  pair<unsigned_long,_unsigned_long> w;
  pair<unsigned_long,_unsigned_long> v;
  uint64_t z;
  uint64_t y;
  uint64_t x;
  size_t len_local;
  char *s_local;
  
  x = len;
  len_local = (size_t)s;
  if (len < 0x21) {
    if (len < 0x11) {
      s_local = (char *)HashLen0to16(s,len);
    }
    else {
      s_local = (char *)HashLen17to32(s,len);
    }
  }
  else if (len < 0x41) {
    s_local = (char *)HashLen33to64(s,len);
  }
  else {
    y = Fetch64(s + (len - 0x28));
    uVar2 = Fetch64((char *)(len_local + x + -0x10));
    uVar3 = Fetch64((char *)(len_local + x + -0x38));
    z = uVar2 + uVar3;
    uVar2 = Fetch64((char *)(len_local + x + -0x30));
    uVar2 = uVar2 + x;
    uVar3 = Fetch64((char *)(len_local + x + -0x18));
    v.second = HashLen16(uVar2,uVar3);
    join_0x00000010_0x00000000_ = WeakHashLen32WithSeeds((char *)(len_local + x + -0x40),x,v.second)
    ;
    _local_58 = WeakHashLen32WithSeeds((char *)(len_local + x + -0x20),z + 0xb492b66fbe98f273,y);
    lVar4 = y * -0x4b6d499041670d8d;
    uVar2 = Fetch64((char *)len_local);
    y = lVar4 + uVar2;
    x = x - 1 & 0xffffffffffffffc0;
    do {
      lVar4 = y + z + w.second;
      uVar2 = Fetch64((char *)(len_local + 8));
      uVar2 = Rotate(lVar4 + uVar2,0x25);
      y = uVar2 * -0x4b6d499041670d8d;
      lVar4 = z + v.first;
      uVar2 = Fetch64((char *)(len_local + 0x30));
      uVar2 = Rotate(lVar4 + uVar2,0x2a);
      y = w.first ^ y;
      uVar1 = w.second;
      uVar3 = Fetch64((char *)(len_local + 0x28));
      z = uVar1 + uVar3 + uVar2 * -0x4b6d499041670d8d;
      uVar2 = Rotate(v.second + (long)local_58,0x21);
      v.second = uVar2 * -0x4b6d499041670d8d;
      local_68 = WeakHashLen32WithSeeds
                           ((char *)len_local,v.first * -0x4b6d499041670d8d,y + (long)local_58);
      std::pair<unsigned_long,_unsigned_long>::operator=
                ((pair<unsigned_long,_unsigned_long> *)&w.second,&local_68);
      s_00 = (char *)(len_local + 0x20);
      uVar2 = v.second + w.first;
      uVar3 = Fetch64((char *)(len_local + 0x10));
      local_78 = WeakHashLen32WithSeeds(s_00,uVar2,z + uVar3);
      std::pair<unsigned_long,_unsigned_long>::operator=
                ((pair<unsigned_long,_unsigned_long> *)local_58,&local_78);
      std::swap<unsigned_long>(&v.second,&y);
      len_local = len_local + 0x40;
      x = x - 0x40;
    } while (x != 0);
    uVar2 = HashLen16(w.second,(uint64_t)local_58);
    uVar3 = ShiftMix(z);
    uVar2 = uVar2 + uVar3 * -0x4b6d499041670d8d + v.second;
    uVar3 = HashLen16(v.first,w.first);
    s_local = (char *)HashLen16(uVar2,uVar3 + y);
  }
  return (uint64_t)s_local;
}

Assistant:

uint64_t CityHash64(const char *s, size_t len) {
  if (len <= 32) {
    if (len <= 16) {
      return HashLen0to16(s, len);
    } else {
      return HashLen17to32(s, len);
    }
  } else if (len <= 64) {
    return HashLen33to64(s, len);
  }

  // For strings over 64 bytes we hash the end first, and then as we
  // loop we keep 56 bytes of state: v, w, x, y, and z.
  uint64_t x = Fetch64(s + len - 40);
  uint64_t y = Fetch64(s + len - 16) + Fetch64(s + len - 56);
  uint64_t z = HashLen16(Fetch64(s + len - 48) + len, Fetch64(s + len - 24));
  std::pair<uint64_t, uint64_t> v =
      WeakHashLen32WithSeeds(s + len - 64, len, z);
  std::pair<uint64_t, uint64_t> w =
      WeakHashLen32WithSeeds(s + len - 32, y + k1, x);
  x = x * k1 + Fetch64(s);

  // Decrease len to the nearest multiple of 64, and operate on 64-byte chunks.
  len = (len - 1) & ~static_cast<size_t>(63);
  do {
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    len -= 64;
  } while (len != 0);
  return HashLen16(HashLen16(v.first, w.first) + ShiftMix(y) * k1 + z,
                   HashLen16(v.second, w.second) + x);
}